

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::ReadWaveformStatus(AmpIO *this,bool *active,uint32_t *tableIndex)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t read_data;
  uint local_1c;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (6 < uVar2) {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x64524131) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ReadWaveformStatus not implemented for dRAC",0x2b);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
    }
    else {
      local_1c = 0;
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      if (pBVar1 != (BasePort *)0x0) {
        iVar3 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,6,&local_1c);
        if ((char)iVar3 == '\0') {
          return false;
        }
        *active = SUB41(local_1c >> 0x1f,0);
        *tableIndex = local_1c >> 0x10 & 0x3ff;
        return (bool)(char)iVar3;
      }
    }
  }
  return false;
}

Assistant:

bool AmpIO::ReadWaveformStatus(bool &active, uint32_t &tableIndex)
{
    if (GetFirmwareVersion() < 7) return false;

    if (GetHardwareVersion() == dRA1_String) {
        std::cerr << "ReadWaveformStatus not implemented for dRAC" << std::endl;
        return false;
    }

    uint32_t read_data = 0;
    if (!port) return false;
    bool ret = port->ReadQuadlet(BoardId, 6, read_data);
    if (ret) {
        active = read_data&VALID_BIT;
        tableIndex = (read_data>>16)&0x000003ff;
    }
    return ret;
}